

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O0

int pybind11::detail::
    process_attributes<pybind11::name,_pybind11::scope,_pybind11::sibling,_pybind11::arg,_pybind11::arg,_pybind11::arg_v,_pybind11::arg_v,_pybind11::arg_v,_pybind11::arg_v,_pybind11::arg_v,_pybind11::arg_v>
    ::init(EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  process_attribute<pybind11::arg,_void> *in_RCX;
  process_attribute<pybind11::sibling,_void> *in_RDX;
  process_attribute<pybind11::scope,_void> *in_RSI;
  process_attribute<pybind11::arg,_void> *in_R8;
  undefined8 in_R9;
  process_attribute<pybind11::arg_v,_void> *in_stack_00000008;
  process_attribute<pybind11::arg_v,_void> *in_stack_00000010;
  process_attribute<pybind11::arg_v,_void> *in_stack_00000018;
  process_attribute<pybind11::arg_v,_void> *in_stack_00000020;
  process_attribute<pybind11::arg_v,_void> *in_stack_00000028;
  EVP_PKEY_CTX *in_stack_00000030;
  int local_68 [2];
  int unused [12];
  arg_v *args_local_5;
  arg *args_local_4;
  arg *args_local_3;
  sibling *args_local_2;
  scope *args_local_1;
  name *args_local;
  
  local_68[0] = 0;
  unused._40_8_ = in_R9;
  process_attribute<pybind11::name,_void>::init
            ((process_attribute<pybind11::name,_void> *)ctx,in_stack_00000030);
  local_68[1] = 0;
  process_attribute<pybind11::scope,_void>::init(in_RSI,in_stack_00000030);
  unused[0] = 0;
  process_attribute<pybind11::sibling,_void>::init(in_RDX,in_stack_00000030);
  unused[1] = 0;
  process_attribute<pybind11::arg,_void>::init(in_RCX,in_stack_00000030);
  unused[2] = 0;
  process_attribute<pybind11::arg,_void>::init(in_R8,in_stack_00000030);
  unused[3] = 0;
  process_attribute<pybind11::arg_v,_void>::init
            ((process_attribute<pybind11::arg_v,_void> *)unused._40_8_,in_stack_00000030);
  unused[4] = 0;
  process_attribute<pybind11::arg_v,_void>::init(in_stack_00000008,in_stack_00000030);
  unused[5] = 0;
  process_attribute<pybind11::arg_v,_void>::init(in_stack_00000010,in_stack_00000030);
  unused[6] = 0;
  process_attribute<pybind11::arg_v,_void>::init(in_stack_00000018,in_stack_00000030);
  unused[7] = 0;
  process_attribute<pybind11::arg_v,_void>::init(in_stack_00000020,in_stack_00000030);
  unused[8] = 0;
  process_attribute<pybind11::arg_v,_void>::init(in_stack_00000028,in_stack_00000030);
  unused[9] = 0;
  ignore_unused(local_68);
  return extraout_EAX;
}

Assistant:

static void init(const Args&... args, function_record *r) {
        int unused[] = { 0, (process_attribute<typename std::decay<Args>::type>::init(args, r), 0) ... };
        ignore_unused(unused);
    }